

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::OrphanBuilder::asCapability(OrphanBuilder *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  char *pcVar3;
  ClientHook *extraout_RDX_01;
  ClientHook *pCVar4;
  int *in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> OVar5;
  BrokenCapFactory *brokenCapFactory;
  Fault f;
  DebugComparison<capnp::_::BrokenCapFactory_*&,_std::nullptr_t> _kjCondition;
  long *local_48;
  undefined1 local_40 [8];
  undefined1 *local_38;
  SegmentBuilder *local_30;
  char *local_28;
  undefined8 local_20;
  undefined1 local_18;
  
  local_38 = (undefined1 *)&local_48;
  local_48 = globalBrokenCapFactory;
  local_30 = (SegmentBuilder *)0x0;
  local_28 = " != ";
  local_20 = 5;
  local_18 = globalBrokenCapFactory != (long *)0x0;
  if (globalBrokenCapFactory == (long *)0x0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::BrokenCapFactory*&,decltype(nullptr)>&,char_const(&)[192]>
              ((Fault *)local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x8b5,FAILED,"brokenCapFactory != nullptr",
               "_kjCondition,\"Trying to read capabilities without ever having created a capability context.  \" \"To read capabilities from a message, you must imbue it with CapReaderContext, or \" \"use the Cap\'n Proto RPC system.\""
               ,(DebugComparison<capnp::_::BrokenCapFactory_*&,_std::nullptr_t> *)&local_38,
               (char (*) [192])
               "Trying to read capabilities without ever having created a capability context.  To read capabilities from a message, you must imbue it with CapReaderContext, or use the Cap\'n Proto RPC system."
              );
    kj::_::Debug::Fault::fatal((Fault *)local_40);
  }
  if (in_RSI[1] == 0 && *in_RSI == 0) {
    (**(code **)(*globalBrokenCapFactory + 8))(this,globalBrokenCapFactory);
    pCVar4 = extraout_RDX_00;
  }
  else {
    if (*in_RSI == 3) {
      (**(code **)**(undefined8 **)(in_RSI + 4))(&local_38);
      if (local_30 != (SegmentBuilder *)0x0) {
        (this->tag).content = (uint64_t)local_38;
        this->segment = local_30;
        pCVar4 = extraout_RDX;
        goto LAB_0018fe38;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                ((Fault *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8c4,FAILED,(char *)0x0,"\"Message contains invalid capability pointer.\"",
                 (char (*) [45])"Message contains invalid capability pointer.");
      kj::_::Debug::Fault::~Fault((Fault *)&local_38);
      puVar1 = (undefined8 *)*local_48;
      pcVar3 = "Calling invalid capability pointer.";
      uVar2 = 0x24;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[96]>
                ((Fault *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8bc,FAILED,(char *)0x0,
                 "\"Schema mismatch: Message contains non-capability pointer where capability pointer was \" \"expected.\""
                 ,(char (*) [96])
                  "Schema mismatch: Message contains non-capability pointer where capability pointer was expected."
                );
      kj::_::Debug::Fault::~Fault((Fault *)&local_38);
      puVar1 = (undefined8 *)*local_48;
      pcVar3 = "Calling capability extracted from a non-capability pointer.";
      uVar2 = 0x3c;
    }
    (*(code *)*puVar1)(this,local_48,pcVar3,uVar2);
    pCVar4 = extraout_RDX_01;
  }
LAB_0018fe38:
  OVar5.ptr = pCVar4;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

kj::Own<ClientHook> OrphanBuilder::asCapability() const {
  return WireHelpers::readCapabilityPointer(segment, capTable, tagAsPtr(), kj::maxValue);
}